

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int zapyourself(obj *obj,boolean ordinary)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  int y;
  int dam;
  char *pcVar4;
  bool bVar5;
  byte local_149;
  obj *poStack_130;
  boolean didmerge;
  obj *onext;
  obj *otemp;
  char local_118 [4];
  int msg;
  char buf [256];
  int damage;
  boolean ordinary_local;
  obj *obj_local;
  
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  buf[0xff] = ordinary;
  switch(obj->otyp) {
  default:
    warning("object %d used?",(ulong)(uint)(int)obj->otyp);
    break;
  case 0x17d:
  case 0x18c:
  case 0x194:
  case 0x1c3:
  case 0x1cd:
  case 0x1cf:
    break;
  case 0x17f:
    pline("You explode a fireball on top of yourself!");
    iVar3 = (int)u.ux;
    y = (int)u.uy;
    dam = dice(6,6);
    explode(iVar3,y,0xb,dam,'\v',5);
    break;
  case 0x182:
  case 0x1d4:
    if ((((youmonst.data)->mlet == '7') || (((youmonst.data)->mflags2 & 2) != 0)) ||
       (((youmonst.data)->mlet == '\x16' ||
        ((youmonst.data == mons + 0x33 || (((youmonst.data)->mflags2 & 0x200) != 0)))))) {
      pcVar4 = "You seem no deader than before.";
      if (obj->otyp == 0x1d4) {
        pcVar4 = "The wand shoots an apparently harmless beam at you.";
      }
      pline(pcVar4);
    }
    else {
      sprintf(local_118,"shot %sself with a death ray",
              genders[(int)(uint)(flags.female != '\0')].him);
      killer = local_118;
      killer_format = 2;
      pline("You irradiate yourself with pure energy!");
      pline("You die.");
      discover_object((int)obj->otyp,'\x01','\x01');
      done(0);
    }
    break;
  case 0x185:
  case 0x196:
    iVar3 = 4;
    if (obj->otyp == 0x196) {
      iVar3 = 8;
    }
    iVar3 = dice(6,iVar3);
    healup(iVar3,0,'\0',obj->otyp == 0x196);
    pcVar4 = "";
    if (obj->otyp == 0x196) {
      pcVar4 = "much ";
    }
    pline("You feel %sbetter.",pcVar4);
    break;
  case 0x18a:
    if (((u.uprops[0x35].intrinsic == 0) && (u.uprops[0x35].extrinsic == 0)) &&
       (bVar2 = resists_drli(&youmonst), bVar2 == '\0')) {
      losexp("life drainage");
      discover_object((int)obj->otyp,'\x01','\x01');
    }
    buf[0xf8] = '\0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    break;
  case 0x18b:
  case 0x1c6:
    if ((u.uprops[0x1a].intrinsic & 0x7ffffff) != 0) {
      u_slow_down();
      discover_object((int)obj->otyp,'\x01','\x01');
    }
    break;
  case 0x19f:
  case 0x1cb:
    tele((char *)0x0);
    break;
  case 0x1a1:
  case 0x1ca:
    cancel_monst(&youmonst,obj,'\x01','\0','\x01');
    break;
  case 0x1a4:
    if (u.umonnum == 0x108) {
      polymon(0x106);
    }
    if (u.uprops[0x21].intrinsic != 0) {
      fix_petrification();
    }
    onext = invent;
    while (onext != (obj *)0x0) {
      poStack_130 = onext->nobj;
      bhito(onext,obj);
      onext = poStack_130;
    }
    do {
      bVar5 = false;
      for (onext = invent; !bVar5 && onext != (obj *)0x0; onext = onext->nobj) {
        for (poStack_130 = onext->nobj; poStack_130 != (obj *)0x0; poStack_130 = poStack_130->nobj)
        {
          iVar3 = merged(&onext,&stack0xfffffffffffffed0);
          if (iVar3 != 0) {
            bVar5 = true;
            break;
          }
        }
      }
    } while (bVar5);
    break;
  case 0x1be:
    buf._248_4_ = dice((int)obj->spe,0x19);
  case 0xea:
    iVar3 = rnd(0x19);
    buf._248_4_ = iVar3 + buf._248_4_;
    bVar2 = resists_blnd(&youmonst);
    if (bVar2 == '\0') {
      pline("You are blinded by the flash!");
      make_blinded((long)(int)buf._248_4_,'\0');
      discover_object((int)obj->otyp,'\x01','\x01');
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pline("Your vision quickly clears.");
      }
    }
    buf[0xf8] = '\0';
    buf[0xf9] = '\0';
    buf[0xfa] = '\0';
    buf[0xfb] = '\0';
    break;
  case 0x1c4:
    discover_object(0x1c4,'\x01','\x01');
  case 0x187:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar2 = resists_magm(&youmonst), bVar2 == '\0')))) {
      if (buf[0xff] == '\0') {
        buf._248_4_ = dice(obj->spe + 1,6);
      }
      else {
        pline("You bash yourself!");
        buf._248_4_ = dice(2,0xc);
      }
      exercise(0,'\0');
    }
    else {
      shieldeff(u.ux,u.uy);
      pline("Boing!");
    }
    break;
  case 0x1c5:
    if ((((((u.uprops[0xd].intrinsic == 0) && (u.uprops[0xd].extrinsic == 0)) &&
          (youmonst.data != mons + 0x9e)) && (youmonst.data != mons + 0x7b)) ||
        (local_149 = 0, u.uprops[0xd].blocked != 0)) &&
       ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((local_149 = 0, ublindf != (obj *)0x0 && (local_149 = 0, ublindf->oartifact == '\x1d'))))))
    {
      local_149 = u.uprops[0xd].blocked != 0 ^ 0xff;
    }
    otemp._4_4_ = (uint)(local_149 & 1);
    if ((u.uprops[0xd].blocked == 0) || (uarmc->otyp != 0x7c)) {
      if ((ordinary == '\0') && (iVar3 = rn2(10), iVar3 != 0)) {
        iVar3 = dice((int)obj->spe,0xfa);
        incr_itimeout(&u.uprops[0xd].intrinsic,(long)iVar3);
      }
      else {
        u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic | 0x4000000;
      }
      if (otemp._4_4_ != 0) {
        discover_object(0x1c5,'\x01','\x01');
        newsym((int)u.ux,(int)u.uy);
        self_invis_message();
      }
    }
    else {
      pcVar4 = xname(uarmc);
      pline("You feel rather itchy under your %s.",pcVar4);
    }
    break;
  case 0x1c7:
    if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
      if ((u.uprops[0x1a].intrinsic == 0) && (u.uprops[0x1a].extrinsic == 0)) {
        pline("You speed up.");
      }
      else {
        pline("Your quickness feels more natural.");
      }
      discover_object(0x1c7,'\x01','\x01');
      exercise(3,'\x01');
    }
    u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
    break;
  case 0x1c8:
    discover_object(0x1c8,'\x01','\x01');
  case 0x19d:
    unturn_dead(&youmonst);
    if (((youmonst.data)->mflags2 & 2) == 0) {
      pline("You shudder in dread.");
    }
    else {
      pline("You feel frightened and %sstunned.");
      uVar1 = u.uprops[0x1b].intrinsic;
      iVar3 = rnd(0x1e);
      make_stunned((ulong)(uVar1 + iVar3),'\0');
    }
    break;
  case 0x1c9:
    if ((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) {
      discover_object(0x1c9,'\x01','\x01');
    }
  case 0x19e:
    if ((u.uprops[0x3d].intrinsic == 0) && (u.uprops[0x3d].extrinsic == 0)) {
      polyself('\0');
    }
    break;
  case 0x1cc:
    if (uball != (obj *)0x0) {
      discover_object(0x1cc,'\x01','\x01');
    }
  case 0x186:
    if (uball != (obj *)0x0) {
      pline("Your chain quivers for a moment.");
    }
    break;
  case 0x1ce:
    if (u.umonnum != u.umonster) {
      discover_randomized_dragon(youmonst.data,"You discover that you are %s.");
    }
    for (_damage = invent; _damage != (obj *)0x0; _damage = _damage->nobj) {
      *(uint *)&_damage->field_0x4a = *(uint *)&_damage->field_0x4a & 0xffffffdf | 0x20;
    }
    discover_object(0x1ce,'\x01','\x01');
    ustatusline();
    break;
  case 0x1d0:
    discover_object(0x1d0,'\x01','\x01');
  case 0x17e:
    pline("You\'ve shot yourself!");
    sprintf(local_118,"shot %sself with a magic missile",
            genders[(int)(uint)(flags.female != '\0')].him);
    iVar3 = dice(4,6);
    mana_damageu(iVar3,(monst *)0x0,local_118,2,'\x01');
    break;
  case 0x1d1:
    discover_object(0x1d1,'\x01','\x01');
  case 0x100:
    pline("You\'ve set yourself afire!");
    sprintf(local_118,"shot %sself with a bolt of fire",
            genders[(int)(uint)(flags.female != '\0')].him);
    iVar3 = dice(0xc,6);
    fire_damageu(iVar3,(monst *)0x0,local_118,2,0x14,'\x01','\0');
    break;
  case 0x1d2:
    discover_object(0x1d2,'\x01','\x01');
  case 0xff:
  case 0x180:
    pline("You imitate a popsicle!");
    pcVar4 = "bolt";
    if (obj->otyp == 0x180) {
      pcVar4 = "cone";
    }
    sprintf(local_118,"shot %sself with a %s of cold",genders[(int)(uint)(flags.female != '\0')].him
            ,pcVar4);
    iVar3 = dice(0xc,6);
    cold_damageu(iVar3,(monst *)0x0,local_118,2,0x14);
    break;
  case 0x1d3:
    discover_object(0x1d3,'\x01','\x01');
  case 0x181:
    if (((((u.uprops[3].intrinsic == 0) && (u.uprops[3].extrinsic == 0)) &&
         ((youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) ||
       ((((u.uprops[3].intrinsic & 0x4000000) != 0 && ((u.uprops[3].intrinsic & 0xfbffffff) == 0))
        && ((u.uprops[3].extrinsic == 0 &&
            (((youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))))))) {
      pline("The sleep ray hits you!");
      bVar5 = false;
      if (((u.uprops[3].intrinsic & 0x4000000) != 0) &&
         (((bVar5 = false, (u.uprops[3].intrinsic & 0xfbffffff) == 0 &&
           (bVar5 = false, u.uprops[3].extrinsic == 0)) &&
          (bVar5 = false, (youmonst.mintrinsics & 4) == 0)))) {
        bVar5 = u.uprops[0x38].extrinsic == 0;
      }
      iVar3 = 0x32;
      if (bVar5) {
        iVar3 = 0x19;
      }
      iVar3 = rnd(iVar3);
      fall_asleep(-iVar3,'\x01');
    }
    else {
      shieldeff(u.ux,u.uy);
      pline("You don\'t feel sleepy!");
    }
    break;
  case 0x1d5:
    discover_object(0x1d5,'\x01','\x01');
    pline("You shock yourself!");
    sprintf(local_118,"show %sself with a bolt of lightning",
            genders[(int)(uint)(flags.female != '\0')].him);
    iVar3 = dice(0xc,6);
    elec_damageu(iVar3,(monst *)0x0,local_118,2,0x14,'\x01');
  }
  iVar3._0_1_ = buf[0xf8];
  iVar3._1_1_ = buf[0xf9];
  iVar3._2_1_ = buf[0xfa];
  iVar3._3_1_ = buf[0xfb];
  return iVar3;
}

Assistant:

int zapyourself(struct obj *obj, boolean ordinary)
{
	int	damage = 0;
	char buf[BUFSZ];

	switch(obj->otyp) {
		case WAN_STRIKING:
		    makeknown(WAN_STRIKING);
		case SPE_FORCE_BOLT:
		    if (Antimagic) {
			shieldeff(u.ux, u.uy);
			pline("Boing!");
		    } else {
			if (ordinary) {
			    pline("You bash yourself!");
			    damage = dice(2,12);
			} else
			    damage = dice(1 + obj->spe,6);
			exercise(A_STR, FALSE);
		    }
		    break;

		case WAN_LIGHTNING:
		    makeknown(WAN_LIGHTNING);
		    pline("You shock yourself!");
		    sprintf(buf, "show %sself with a bolt of lightning", uhim());
		    elec_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX, 20, TRUE);
		    break;

		case SPE_FIREBALL:
		    pline("You explode a fireball on top of yourself!");
		    explode(u.ux, u.uy, 11, dice(6,6), WAND_CLASS, EXPL_FIERY);
		    break;
		case WAN_FIRE:
		    makeknown(WAN_FIRE);
		case FIRE_HORN:
		    pline("You've set yourself afire!");
		    sprintf(buf, "shot %sself with a bolt of fire", uhim());
		    fire_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX,
				 20, TRUE, FALSE);
		    break;

		case WAN_COLD:
		    makeknown(WAN_COLD);
		case SPE_CONE_OF_COLD:
		case FROST_HORN:
		    pline("You imitate a popsicle!");
		    sprintf(buf, "shot %sself with a %s of cold", uhim(),
			    obj->otyp == SPE_CONE_OF_COLD ? "cone" : "bolt");
		    cold_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX, 20);
		    break;

		case WAN_MAGIC_MISSILE:
		    makeknown(WAN_MAGIC_MISSILE);
		case SPE_MAGIC_MISSILE:
		    pline("You've shot yourself!");
		    sprintf(buf, "shot %sself with a magic missile", uhim());
		    mana_damageu(dice(4, 6), NULL, buf, NO_KILLER_PREFIX, TRUE);
		    break;

		case WAN_POLYMORPH:
		    if (!Unchanging)
		    	makeknown(WAN_POLYMORPH);
		case SPE_POLYMORPH:
		    if (!Unchanging)
		    	polyself(FALSE);
		    break;

		case WAN_CANCELLATION:
		case SPE_CANCELLATION:
		    cancel_monst(&youmonst, obj, TRUE, FALSE, TRUE);
		    break;

		case SPE_DRAIN_LIFE:
			if (!Drain_resistance) {
				losexp("life drainage");
				makeknown(obj->otyp);
			}
			damage = 0;	/* No additional damage */
			break;

		case WAN_MAKE_INVISIBLE: {
		    /* have to test before changing HInvis but must change
		     * HInvis before doing newsym().
		     */
		    int msg = !Invis && !Blind && !BInvis;

		    if (BInvis && uarmc->otyp == MUMMY_WRAPPING) {
			/* A mummy wrapping absorbs it and protects you */
		        pline("You feel rather itchy under your %s.", xname(uarmc));
		        break;
		    }
		    if (ordinary || !rn2(10)) {	/* permanent */
			HInvis |= FROMOUTSIDE;
		    } else {			/* temporary */
		    	incr_itimeout(&HInvis, dice(obj->spe, 250));
		    }
		    if (msg) {
			makeknown(WAN_MAKE_INVISIBLE);
			newsym(u.ux, u.uy);
			self_invis_message();
		    }
		    break;
		}

		case WAN_SPEED_MONSTER:
		    if (!(HFast & INTRINSIC)) {
			if (!Fast)
			    pline("You speed up.");
			else
			    pline("Your quickness feels more natural.");
			makeknown(WAN_SPEED_MONSTER);
			exercise(A_DEX, TRUE);
		    }
		    HFast |= FROMOUTSIDE;
		    break;

		case WAN_SLEEP:
		    makeknown(WAN_SLEEP);
		case SPE_SLEEP:
		    if (FSleep_resistance) {
			shieldeff(u.ux, u.uy);
			pline("You don't feel sleepy!");
		    } else {
			pline("The sleep ray hits you!");
			fall_asleep(-rnd(PSleep_resistance ? 25 : 50), TRUE);
		    }
		    break;

		case WAN_SLOW_MONSTER:
		case SPE_SLOW_MONSTER:
		    if (HFast & (TIMEOUT | INTRINSIC)) {
			u_slow_down();
			makeknown(obj->otyp);
		    }
		    break;

		case WAN_TELEPORTATION:
		case SPE_TELEPORT_AWAY:
		    tele(NULL);
		    break;

		case WAN_DEATH:
		case SPE_FINGER_OF_DEATH:
		    if (nonliving(youmonst.data) || is_demon(youmonst.data)) {
			pline((obj->otyp == WAN_DEATH) ?
			  "The wand shoots an apparently harmless beam at you."
			  : "You seem no deader than before.");
			break;
		    }
		    sprintf(buf, "shot %sself with a death ray", uhim());
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		    pline("You irradiate yourself with pure energy!");
		    pline("You die.");
		    makeknown(obj->otyp);
			/* They might survive with an amulet of life saving */
		    done(DIED);
		    break;
		case WAN_UNDEAD_TURNING:
		    makeknown(WAN_UNDEAD_TURNING);
		case SPE_TURN_UNDEAD:
		    unturn_dead(&youmonst);
		    if (is_undead(youmonst.data)) {
			pline("You feel frightened and %sstunned.",
			     Stunned ? "even more " : "");
			make_stunned(HStun + rnd(30), FALSE);
		    } else
			pline("You shudder in dread.");
		    break;
		case SPE_HEALING:
		case SPE_EXTRA_HEALING:
		    healup(dice(6, obj->otyp == SPE_EXTRA_HEALING ? 8 : 4),
			   0, FALSE, (obj->otyp == SPE_EXTRA_HEALING));
		    pline("You feel %sbetter.",
			obj->otyp == SPE_EXTRA_HEALING ? "much " : "");
		    break;
		case WAN_LIGHT:	/* (broken wand) */
		 /* assert( !ordinary ); */
		    damage = dice(obj->spe, 25);
		case EXPENSIVE_CAMERA:
		    damage += rnd(25);
		    if (!resists_blnd(&youmonst)) {
			pline(blinded_by_the_flash);
			make_blinded((long)damage, FALSE);
			makeknown(obj->otyp);
			if (!Blind) pline("Your vision quickly clears.");
		    }
		    damage = 0;	/* reset */
		    break;
		case WAN_OPENING:
		    if (Punished) makeknown(WAN_OPENING);
		case SPE_KNOCK:
		    if (Punished) pline("Your chain quivers for a moment.");
		    break;
		case WAN_DIGGING:
		case SPE_DIG:
		case SPE_DETECT_UNSEEN:
		case WAN_NOTHING:
		case WAN_LOCKING:
		case SPE_WIZARD_LOCK:
		    break;
		case WAN_PROBING:
		    if (Upolyd) {
			discover_randomized_dragon(youmonst.data,
				"You discover that you are %s.");
		    }
		    for (obj = invent; obj; obj = obj->nobj)
			obj->dknown = 1;
		    /* note: `obj' reused; doesn't point at wand anymore */
		    makeknown(WAN_PROBING);
		    ustatusline();
		    break;
		case SPE_STONE_TO_FLESH:
		    {
		    struct obj *otemp, *onext;
		    boolean didmerge;

		    if (u.umonnum == PM_STONE_GOLEM)
			polymon(PM_FLESH_GOLEM);
		    if (Stoned) fix_petrification();	/* saved! */
		    /* but at a cost.. */
		    for (otemp = invent; otemp; otemp = onext) {
			onext = otemp->nobj;
			bhito(otemp, obj);
			}
		    /*
		     * It is possible that we can now merge some inventory.
		     * Do a higly paranoid merge.  Restart from the beginning
		     * until no merges.
		     */
		    do {
			didmerge = FALSE;
			for (otemp = invent; !didmerge && otemp; otemp = otemp->nobj)
			    for (onext = otemp->nobj; onext; onext = onext->nobj)
			    	if (merged(&otemp, &onext)) {
			    		didmerge = TRUE;
			    		break;
			    		}
		    } while (didmerge);
		    }
		    break;
		default: warning("object %d used?",obj->otyp);
		    break;
	}
	return damage;
}